

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O1

int __thiscall GGWave::rxTakeData(GGWave *this,TxRxData *dst)

{
  int iVar1;
  
  iVar1 = (this->m_rx).dataLength;
  if (iVar1 != 0) {
    (this->m_rx).dataLength = 0;
    if (iVar1 != -1) {
      dst->m_data = (this->m_rx).data.m_data;
      dst->m_size = iVar1;
    }
    return iVar1;
  }
  return 0;
}

Assistant:

int GGWave::rxTakeData(TxRxData & dst) {
    if (m_rx.dataLength == 0) return 0;

    auto res = m_rx.dataLength;
    m_rx.dataLength = 0;

    if (res != -1) {
        dst.assign({ m_rx.data.data(), res });
    }

    return res;
}